

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_paddsb_mips(uint64_t fs,uint64_t ft)

{
  int local_38;
  uint8_t local_34;
  uint local_2c;
  int r;
  uint i;
  LMIValue vt;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.d = fs;
  _r = ft;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    local_38 = (int)vt.sb[local_2c] + (int)*(char *)((long)&r + (ulong)local_2c);
    if (local_38 < -0x80) {
      local_34 = 0x80;
    }
    else {
      if (0x7f < local_38) {
        local_38 = 0x7f;
      }
      local_34 = (uint8_t)local_38;
    }
    vt.ub[local_2c] = local_34;
  }
  return vt.d;
}

Assistant:

uint64_t helper_paddsb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        int r = vs.sb[i] + vt.sb[i];
        vs.sb[i] = SATSB(r);
    }
    return vs.d;
}